

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000146690 = 0x2e2e2e2e2e2e2e;
    uRam0000000000146697 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00146680 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000146688 = 0x2e2e2e2e2e2e2e;
    DAT_0014668f = 0x2e;
    _DAT_00146670 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000146678 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00146660 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000146668 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000146658 = 0x2e2e2e2e2e2e2e2e;
    DAT_0014669f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }